

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void write_buffer_16x16(__m128i *in,int32_t *output)

{
  longlong lVar1;
  
  lVar1 = (*in)[1];
  *(longlong *)output = (*in)[0];
  *(longlong *)(output + 2) = lVar1;
  lVar1 = in[1][1];
  *(longlong *)(output + 4) = in[1][0];
  *(longlong *)(output + 6) = lVar1;
  lVar1 = in[2][1];
  *(longlong *)(output + 8) = in[2][0];
  *(longlong *)(output + 10) = lVar1;
  lVar1 = in[3][1];
  *(longlong *)(output + 0xc) = in[3][0];
  *(longlong *)(output + 0xe) = lVar1;
  lVar1 = in[4][1];
  *(longlong *)(output + 0x10) = in[4][0];
  *(longlong *)(output + 0x12) = lVar1;
  lVar1 = in[5][1];
  *(longlong *)(output + 0x14) = in[5][0];
  *(longlong *)(output + 0x16) = lVar1;
  lVar1 = in[6][1];
  *(longlong *)(output + 0x18) = in[6][0];
  *(longlong *)(output + 0x1a) = lVar1;
  lVar1 = in[7][1];
  *(longlong *)(output + 0x1c) = in[7][0];
  *(longlong *)(output + 0x1e) = lVar1;
  lVar1 = in[8][1];
  *(longlong *)(output + 0x20) = in[8][0];
  *(longlong *)(output + 0x22) = lVar1;
  lVar1 = in[9][1];
  *(longlong *)(output + 0x24) = in[9][0];
  *(longlong *)(output + 0x26) = lVar1;
  lVar1 = in[10][1];
  *(longlong *)(output + 0x28) = in[10][0];
  *(longlong *)(output + 0x2a) = lVar1;
  lVar1 = in[0xb][1];
  *(longlong *)(output + 0x2c) = in[0xb][0];
  *(longlong *)(output + 0x2e) = lVar1;
  lVar1 = in[0xc][1];
  *(longlong *)(output + 0x30) = in[0xc][0];
  *(longlong *)(output + 0x32) = lVar1;
  lVar1 = in[0xd][1];
  *(longlong *)(output + 0x34) = in[0xd][0];
  *(longlong *)(output + 0x36) = lVar1;
  lVar1 = in[0xe][1];
  *(longlong *)(output + 0x38) = in[0xe][0];
  *(longlong *)(output + 0x3a) = lVar1;
  lVar1 = in[0xf][1];
  *(longlong *)(output + 0x3c) = in[0xf][0];
  *(longlong *)(output + 0x3e) = lVar1;
  lVar1 = in[0x10][1];
  *(longlong *)(output + 0x40) = in[0x10][0];
  *(longlong *)(output + 0x42) = lVar1;
  lVar1 = in[0x11][1];
  *(longlong *)(output + 0x44) = in[0x11][0];
  *(longlong *)(output + 0x46) = lVar1;
  lVar1 = in[0x12][1];
  *(longlong *)(output + 0x48) = in[0x12][0];
  *(longlong *)(output + 0x4a) = lVar1;
  lVar1 = in[0x13][1];
  *(longlong *)(output + 0x4c) = in[0x13][0];
  *(longlong *)(output + 0x4e) = lVar1;
  lVar1 = in[0x14][1];
  *(longlong *)(output + 0x50) = in[0x14][0];
  *(longlong *)(output + 0x52) = lVar1;
  lVar1 = in[0x15][1];
  *(longlong *)(output + 0x54) = in[0x15][0];
  *(longlong *)(output + 0x56) = lVar1;
  lVar1 = in[0x16][1];
  *(longlong *)(output + 0x58) = in[0x16][0];
  *(longlong *)(output + 0x5a) = lVar1;
  lVar1 = in[0x17][1];
  *(longlong *)(output + 0x5c) = in[0x17][0];
  *(longlong *)(output + 0x5e) = lVar1;
  lVar1 = in[0x18][1];
  *(longlong *)(output + 0x60) = in[0x18][0];
  *(longlong *)(output + 0x62) = lVar1;
  lVar1 = in[0x19][1];
  *(longlong *)(output + 100) = in[0x19][0];
  *(longlong *)(output + 0x66) = lVar1;
  lVar1 = in[0x1a][1];
  *(longlong *)(output + 0x68) = in[0x1a][0];
  *(longlong *)(output + 0x6a) = lVar1;
  lVar1 = in[0x1b][1];
  *(longlong *)(output + 0x6c) = in[0x1b][0];
  *(longlong *)(output + 0x6e) = lVar1;
  lVar1 = in[0x1c][1];
  *(longlong *)(output + 0x70) = in[0x1c][0];
  *(longlong *)(output + 0x72) = lVar1;
  lVar1 = in[0x1d][1];
  *(longlong *)(output + 0x74) = in[0x1d][0];
  *(longlong *)(output + 0x76) = lVar1;
  lVar1 = in[0x1e][1];
  *(longlong *)(output + 0x78) = in[0x1e][0];
  *(longlong *)(output + 0x7a) = lVar1;
  lVar1 = in[0x1f][1];
  *(longlong *)(output + 0x7c) = in[0x1f][0];
  *(longlong *)(output + 0x7e) = lVar1;
  lVar1 = in[0x20][1];
  *(longlong *)(output + 0x80) = in[0x20][0];
  *(longlong *)(output + 0x82) = lVar1;
  lVar1 = in[0x21][1];
  *(longlong *)(output + 0x84) = in[0x21][0];
  *(longlong *)(output + 0x86) = lVar1;
  lVar1 = in[0x22][1];
  *(longlong *)(output + 0x88) = in[0x22][0];
  *(longlong *)(output + 0x8a) = lVar1;
  lVar1 = in[0x23][1];
  *(longlong *)(output + 0x8c) = in[0x23][0];
  *(longlong *)(output + 0x8e) = lVar1;
  lVar1 = in[0x24][1];
  *(longlong *)(output + 0x90) = in[0x24][0];
  *(longlong *)(output + 0x92) = lVar1;
  lVar1 = in[0x25][1];
  *(longlong *)(output + 0x94) = in[0x25][0];
  *(longlong *)(output + 0x96) = lVar1;
  lVar1 = in[0x26][1];
  *(longlong *)(output + 0x98) = in[0x26][0];
  *(longlong *)(output + 0x9a) = lVar1;
  lVar1 = in[0x27][1];
  *(longlong *)(output + 0x9c) = in[0x27][0];
  *(longlong *)(output + 0x9e) = lVar1;
  lVar1 = in[0x28][1];
  *(longlong *)(output + 0xa0) = in[0x28][0];
  *(longlong *)(output + 0xa2) = lVar1;
  lVar1 = in[0x29][1];
  *(longlong *)(output + 0xa4) = in[0x29][0];
  *(longlong *)(output + 0xa6) = lVar1;
  lVar1 = in[0x2a][1];
  *(longlong *)(output + 0xa8) = in[0x2a][0];
  *(longlong *)(output + 0xaa) = lVar1;
  lVar1 = in[0x2b][1];
  *(longlong *)(output + 0xac) = in[0x2b][0];
  *(longlong *)(output + 0xae) = lVar1;
  lVar1 = in[0x2c][1];
  *(longlong *)(output + 0xb0) = in[0x2c][0];
  *(longlong *)(output + 0xb2) = lVar1;
  lVar1 = in[0x2d][1];
  *(longlong *)(output + 0xb4) = in[0x2d][0];
  *(longlong *)(output + 0xb6) = lVar1;
  lVar1 = in[0x2e][1];
  *(longlong *)(output + 0xb8) = in[0x2e][0];
  *(longlong *)(output + 0xba) = lVar1;
  lVar1 = in[0x2f][1];
  *(longlong *)(output + 0xbc) = in[0x2f][0];
  *(longlong *)(output + 0xbe) = lVar1;
  lVar1 = in[0x30][1];
  *(longlong *)(output + 0xc0) = in[0x30][0];
  *(longlong *)(output + 0xc2) = lVar1;
  lVar1 = in[0x31][1];
  *(longlong *)(output + 0xc4) = in[0x31][0];
  *(longlong *)(output + 0xc6) = lVar1;
  lVar1 = in[0x32][1];
  *(longlong *)(output + 200) = in[0x32][0];
  *(longlong *)(output + 0xca) = lVar1;
  lVar1 = in[0x33][1];
  *(longlong *)(output + 0xcc) = in[0x33][0];
  *(longlong *)(output + 0xce) = lVar1;
  lVar1 = in[0x34][1];
  *(longlong *)(output + 0xd0) = in[0x34][0];
  *(longlong *)(output + 0xd2) = lVar1;
  lVar1 = in[0x35][1];
  *(longlong *)(output + 0xd4) = in[0x35][0];
  *(longlong *)(output + 0xd6) = lVar1;
  lVar1 = in[0x36][1];
  *(longlong *)(output + 0xd8) = in[0x36][0];
  *(longlong *)(output + 0xda) = lVar1;
  lVar1 = in[0x37][1];
  *(longlong *)(output + 0xdc) = in[0x37][0];
  *(longlong *)(output + 0xde) = lVar1;
  lVar1 = in[0x38][1];
  *(longlong *)(output + 0xe0) = in[0x38][0];
  *(longlong *)(output + 0xe2) = lVar1;
  lVar1 = in[0x39][1];
  *(longlong *)(output + 0xe4) = in[0x39][0];
  *(longlong *)(output + 0xe6) = lVar1;
  lVar1 = in[0x3a][1];
  *(longlong *)(output + 0xe8) = in[0x3a][0];
  *(longlong *)(output + 0xea) = lVar1;
  lVar1 = in[0x3b][1];
  *(longlong *)(output + 0xec) = in[0x3b][0];
  *(longlong *)(output + 0xee) = lVar1;
  lVar1 = in[0x3c][1];
  *(longlong *)(output + 0xf0) = in[0x3c][0];
  *(longlong *)(output + 0xf2) = lVar1;
  lVar1 = in[0x3d][1];
  *(longlong *)(output + 0xf4) = in[0x3d][0];
  *(longlong *)(output + 0xf6) = lVar1;
  lVar1 = in[0x3e][1];
  *(longlong *)(output + 0xf8) = in[0x3e][0];
  *(longlong *)(output + 0xfa) = lVar1;
  lVar1 = in[0x3f][1];
  *(longlong *)(output + 0xfc) = in[0x3f][0];
  *(longlong *)(output + 0xfe) = lVar1;
  return;
}

Assistant:

static inline void write_buffer_8x8(const __m128i *res, int32_t *output) {
  _mm_store_si128((__m128i *)(output + 0 * 4), res[0]);
  _mm_store_si128((__m128i *)(output + 1 * 4), res[1]);
  _mm_store_si128((__m128i *)(output + 2 * 4), res[2]);
  _mm_store_si128((__m128i *)(output + 3 * 4), res[3]);

  _mm_store_si128((__m128i *)(output + 4 * 4), res[4]);
  _mm_store_si128((__m128i *)(output + 5 * 4), res[5]);
  _mm_store_si128((__m128i *)(output + 6 * 4), res[6]);
  _mm_store_si128((__m128i *)(output + 7 * 4), res[7]);

  _mm_store_si128((__m128i *)(output + 8 * 4), res[8]);
  _mm_store_si128((__m128i *)(output + 9 * 4), res[9]);
  _mm_store_si128((__m128i *)(output + 10 * 4), res[10]);
  _mm_store_si128((__m128i *)(output + 11 * 4), res[11]);

  _mm_store_si128((__m128i *)(output + 12 * 4), res[12]);
  _mm_store_si128((__m128i *)(output + 13 * 4), res[13]);
  _mm_store_si128((__m128i *)(output + 14 * 4), res[14]);
  _mm_store_si128((__m128i *)(output + 15 * 4), res[15]);
}